

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O1

bool __thiscall test_CEPlanet::test_earth(test_CEPlanet *this)

{
  double new_jd;
  undefined1 uVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  CEPlanet earth;
  allocator<double> local_292;
  allocator<double> local_291;
  CEAngle local_290;
  CEAngle local_280;
  CEAngle local_270;
  CEAngle local_260;
  CESkyCoordType local_250 [2];
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> local_230;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  CESkyCoord local_1f8;
  CESkyCoord local_1c8;
  double local_198 [4];
  double local_178 [4];
  CEPlanet local_158;
  
  CEPlanet::Earth();
  new_jd = CEDate::JD(&this->base_date_);
  CEPlanet::UpdateCoordinates(&local_158,new_jd);
  local_200 = 101.76551344173983;
  CEAngle::Deg(&local_260,&local_200);
  local_208 = 23.010343489518878;
  CEAngle::Deg(&local_270,&local_208);
  local_250[1] = 1;
  CESkyCoord::CESkyCoord(&local_1c8,&local_260,&local_270,local_250 + 1);
  local_210 = 89.99999999913862;
  CEAngle::Deg(&local_280,&local_210);
  local_218 = 179.9999111107913;
  CEAngle::Deg(&local_290,&local_218);
  local_250[0] = OBSERVED;
  CESkyCoord::CESkyCoord(&local_1f8,&local_280,&local_290,local_250);
  local_178[0] = -0.18428431;
  local_178[1] = 0.88477935;
  local_178[2] = 0.383819;
  std::allocator<double>::allocator(&local_291);
  __l._M_len = 3;
  __l._M_array = local_178;
  std::vector<double,_std::allocator<double>_>::vector(&local_230,__l,&local_291);
  local_198[0] = -0.01720221;
  local_198[1] = -0.00290513;
  local_198[2] = -0.00125952;
  std::allocator<double>::allocator(&local_292);
  __l_00._M_len = 3;
  __l_00._M_array = local_198;
  std::vector<double,_std::allocator<double>_>::vector(&local_248,__l_00,&local_292);
  (**(code **)(*(long *)this + 200))(this,&local_158,&local_1c8,&local_1f8,&local_230,&local_248);
  std::vector<double,_std::allocator<double>_>::~vector(&local_248);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_292);
  std::vector<double,_std::allocator<double>_>::~vector(&local_230);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_291);
  CESkyCoord::~CESkyCoord(&local_1f8);
  CEAngle::~CEAngle(&local_290);
  CEAngle::~CEAngle(&local_280);
  CESkyCoord::~CESkyCoord(&local_1c8);
  CEAngle::~CEAngle(&local_270);
  CEAngle::~CEAngle(&local_260);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEPlanet::~CEPlanet(&local_158);
  return (bool)uVar1;
}

Assistant:

bool test_CEPlanet::test_earth(void)
{
    // Create the planet object
    CEPlanet earth = CEPlanet::Earth();

    // Update the coordinates
    earth.UpdateCoordinates(base_date_.JD());

    // Run the actual test with values derived from AstroPy
    test_planet(earth,
                CESkyCoord(CEAngle::Deg(101.7655134417398273), 
                           CEAngle::Deg(23.0103434895188776), 
                           CESkyCoordType::ICRS),
                CESkyCoord(CEAngle::Deg(89.9999999991386233),
                           CEAngle::Deg(179.9999111107912881),
                           CESkyCoordType::OBSERVED),
                {-0.18428431, 0.88477935, 0.383819},
                {-0.01720221, -0.00290513, -0.00125952});
    
    return pass();
}